

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall
Connection_nineVariablesTenConnectionsAndParse_Test::
Connection_nineVariablesTenConnectionsAndParse_Test
          (Connection_nineVariablesTenConnectionsAndParse_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00122df0;
  return;
}

Assistant:

TEST(Connection, nineVariablesTenConnectionsAndParse)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable11\"/>\n"
        "    <variable name=\"variable12\"/>\n"
        "    <variable name=\"variable13\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable21\"/>\n"
        "    <variable name=\"variable22\"/>\n"
        "    <variable name=\"variable23\"/>\n"
        "  </component>\n"
        "  <component name=\"component3\">\n"
        "    <variable name=\"variable31\"/>\n"
        "    <variable name=\"variable32\"/>\n"
        "    <variable name=\"variable33\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\">\n"
        "    <map_variables variable_1=\"variable11\" variable_2=\"variable21\"/>\n"
        "    <map_variables variable_1=\"variable12\" variable_2=\"variable22\"/>\n"
        "    <map_variables variable_1=\"variable13\" variable_2=\"variable23\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable11\" variable_2=\"variable31\"/>\n"
        "    <map_variables variable_1=\"variable11\" variable_2=\"variable33\"/>\n"
        "    <map_variables variable_1=\"variable12\" variable_2=\"variable32\"/>\n"
        "    <map_variables variable_1=\"variable13\" variable_2=\"variable33\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component2\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable21\" variable_2=\"variable33\"/>\n"
        "    <map_variables variable_1=\"variable23\" variable_2=\"variable31\"/>\n"
        "    <map_variables variable_1=\"variable23\" variable_2=\"variable33\"/>\n"
        "  </connection>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();
    libcellml::ComponentPtr comp2 = libcellml::Component::create();
    libcellml::ComponentPtr comp3 = libcellml::Component::create();
    libcellml::VariablePtr v11 = libcellml::Variable::create();
    libcellml::VariablePtr v12 = libcellml::Variable::create();
    libcellml::VariablePtr v13 = libcellml::Variable::create();
    libcellml::VariablePtr v21 = libcellml::Variable::create();
    libcellml::VariablePtr v22 = libcellml::Variable::create();
    libcellml::VariablePtr v23 = libcellml::Variable::create();
    libcellml::VariablePtr v31 = libcellml::Variable::create();
    libcellml::VariablePtr v32 = libcellml::Variable::create();
    libcellml::VariablePtr v33 = libcellml::Variable::create();

    comp1->setName("component1");
    comp2->setName("component2");
    comp3->setName("component3");
    v11->setName("variable11");
    v12->setName("variable12");
    v13->setName("variable13");
    v21->setName("variable21");
    v22->setName("variable22");
    v23->setName("variable23");
    v31->setName("variable31");
    v32->setName("variable32");
    v33->setName("variable33");

    comp1->addVariable(v11);
    comp1->addVariable(v12);
    comp1->addVariable(v13);
    comp2->addVariable(v21);
    comp2->addVariable(v22);
    comp2->addVariable(v23);
    comp3->addVariable(v31);
    comp3->addVariable(v32);
    comp3->addVariable(v33);
    m->addComponent(comp1);
    m->addComponent(comp2);
    m->addComponent(comp3);

    libcellml::Variable::addEquivalence(v11, v21);
    libcellml::Variable::addEquivalence(v31, v11);
    libcellml::Variable::addEquivalence(v12, v22);
    libcellml::Variable::addEquivalence(v32, v12);
    libcellml::Variable::addEquivalence(v13, v23);
    libcellml::Variable::addEquivalence(v33, v13);
    libcellml::Variable::addEquivalence(v31, v23);
    libcellml::Variable::addEquivalence(v21, v33);
    libcellml::Variable::addEquivalence(v11, v33);
    libcellml::Variable::addEquivalence(v33, v23);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);

    // Parse
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    a = printer->printModel(model);
    EXPECT_EQ(e, a);
}